

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

tuple<int,_bool> __thiscall
anon_unknown.dwarf_ccf27::preprocessor<baryonyx::raw_problem>::reduce_less_constraint
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  bool local_5c [5];
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  bool local_54 [4];
  undefined1 local_50;
  bool affect_1;
  bool affect_0;
  undefined1 local_38 [16];
  int local_28;
  int result;
  int variable;
  int factor;
  constraint *constraint_local;
  preprocessor<baryonyx::raw_problem> *this_local;
  
  constraint_local = constraint;
  this_local = this;
  reduce((preprocessor<baryonyx::raw_problem> *)local_38,constraint);
  std::tie<int,int,int>
            ((tuple<int_&,_int_&,_int_&> *)&local_50,&result,&local_28,(int *)(local_38 + 0xc));
  std::tuple<int&,int&,int&>::operator=
            ((tuple<int&,int&,int&> *)&local_50,(tuple<int,_int,_int> *)local_38);
  if (local_28 < 0) {
    local_54[0] = true;
    local_54[1] = true;
    local_54[2] = true;
    local_54[3] = true;
    local_55 = 0;
    std::make_tuple<int,bool>((int *)this,local_54);
  }
  else {
    local_56 = -1 < (int)local_38._12_4_;
    local_57 = result <= (int)local_38._12_4_;
    if (((bool)local_56) && ((bool)local_57)) {
      local_5c[0] = true;
      local_5c[1] = true;
      local_5c[2] = true;
      local_5c[3] = true;
      std::make_tuple<int,bool>((int *)this,local_5c);
    }
    else if ((bool)local_56) {
      std::make_tuple<int&,bool>((int *)this,(bool *)&local_28);
    }
    else {
      if (!(bool)local_57) {
        baryonyx::details::fail_fast
                  ("Reached","cond",
                   "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                   ,"262");
      }
      std::make_tuple<int&,bool>((int *)this,(bool *)&local_28);
    }
  }
  return (tuple<int,_bool>)(_Tuple_impl<0UL,_int,_bool>)this;
}

Assistant:

auto reduce_less_constraint(const bx::constraint& constraint)
      -> std::tuple<int, bool>
    {
        int factor, variable, result;

        std::tie(factor, variable, result) = reduce(constraint);

        if (variable < 0)
            return std::make_tuple(-1, false);

        bool affect_0 = (factor * 0 <= result);
        bool affect_1 = (factor * 1 <= result);

        if (affect_0 && affect_1)
            return std::make_tuple(-1, false);

        if (affect_0)
            return std::make_tuple(variable, false);

        if (affect_1)
            return std::make_tuple(variable, true);

        bx_reach();
    }